

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

int get_file_format(char *filename)

{
  int iVar1;
  char *pcVar2;
  char *ext;
  uint i;
  char *filename_local;
  
  pcVar2 = strrchr(filename,0x2e);
  if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
    for (ext._4_4_ = 0; ext._4_4_ < 0x13; ext._4_4_ = ext._4_4_ + 1) {
      iVar1 = strcasecmp(pcVar2 + 1,get_file_format::extension[ext._4_4_]);
      if (iVar1 == 0) {
        return get_file_format::format[ext._4_4_];
      }
    }
  }
  return -1;
}

Assistant:

int get_file_format(const char *filename)
{
    unsigned int i;
    static const char * const extension[] = {
        "pgx", "pnm", "pgm", "ppm", "bmp",
        "tif", "tiff",
        "raw", "yuv", "rawl",
        "tga", "png",
        "j2k", "jp2", "jpt", "j2c", "jpc",
        "jph", /* HTJ2K with JP2 boxes */
        "jhc" /* HTJ2K codestream */
    };
    static const int format[] = {
        PGX_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, BMP_DFMT,
        TIF_DFMT, TIF_DFMT,
        RAW_DFMT, RAW_DFMT, RAWL_DFMT,
        TGA_DFMT, PNG_DFMT,
        J2K_CFMT, JP2_CFMT, JPT_CFMT, J2K_CFMT, J2K_CFMT,
        JP2_CFMT, /* HTJ2K with JP2 boxes */
        J2K_CFMT /* HTJ2K codestream */
    };
    const char * ext = strrchr(filename, '.');
    if (ext == NULL) {
        return -1;
    }
    ext++;
    if (*ext) {
        for (i = 0; i < sizeof(format) / sizeof(*format); i++) {
            if (strcasecmp(ext, extension[i]) == 0) {
                return format[i];
            }
        }
    }

    return -1;
}